

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  sexp_conflict psVar5;
  sexp_conflict op;
  long local_80;
  sexp_conflict tmp;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  name = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  tmp = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  op = (sexp_conflict)0x43e;
  __sexp_gc_preserver3.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver3.next = (sexp_gc_var_t *)0x0;
  iVar1 = strcmp(version,"0.11.0");
  psVar5 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      __sexp_gc_preserver1.var = &name;
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      (ctx->value).context.saves = __sexp_gc_preserver2.next;
      __sexp_gc_preserver2.var = &tmp;
      __sexp_gc_preserver3.next = &__sexp_gc_preserver2;
      (ctx->value).context.saves = __sexp_gc_preserver3.next;
      (ctx->value).context.saves = &__sexp_gc_preserver3;
      __sexp_gc_preserver3.var = &op;
      psVar5 = (sexp_conflict)sexp_intern(ctx,"wait/no-hang",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/tty-output",0x11);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x16,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/tty-input",0x10);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x15,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/tty-stop",0xf);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x14,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/stop",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x13,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/continue",0xf);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x12,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/child",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x11,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/user2",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xc,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/user1",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,10,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/term",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xf,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/alarm",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xe,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/pipe",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xd,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/segv",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0xb,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/kill",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,9,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/fpe",10);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/abort",0xc);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,6,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/illegal",0xe);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/quit",0xb);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,3,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/interrupt",0x10);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      psVar5 = (sexp_conflict)sexp_intern(ctx,"signal/hang-up",0xe);
      name = psVar5;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar5,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"sigset_t",0xffffffffffffffff);
      lVar2 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar2);
      local_80 = lVar2;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar2);
      name = (sexp_conflict)sexp_intern(ctx,"signal-set?",0xb);
      sexp_env_define(ctx,env,name,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"siginfo_t",0xffffffffffffffff);
      lVar3 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar3);
      lVar2 = lVar3 + 0x18;
      *(undefined8 *)(lVar3 + 0x18) = 0x23e;
      uVar4 = sexp_intern(ctx,"si_status",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_intern(ctx,"si_uid",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_intern(ctx,"si_pid",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_intern(ctx,"si_code",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_intern(ctx,"si_errno",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_intern(ctx,"si_signo",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar4);
      uVar4 = sexp_make_vector_op(ctx,0,2,0xd,0x3e);
      *(undefined8 *)(lVar3 + 0x20) = uVar4;
      uVar4 = sexp_make_vector_op(ctx,0,2,0xd,0x3e);
      *(undefined8 *)(lVar3 + 0x28) = uVar4;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar3);
      name = (sexp_conflict)sexp_intern(ctx,"signal-info?",0xc);
      sexp_env_define(ctx,env,name,tmp);
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-status",1,0,"sexp_siginfo_t_get_si_status",
                      sexp_siginfo_t_get_si_status,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-uid",1,0,"sexp_siginfo_t_get_si_uid",sexp_siginfo_t_get_si_uid
                      ,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-pid",1,0,"sexp_siginfo_t_get_si_pid",sexp_siginfo_t_get_si_pid
                      ,0);
      lVar2 = local_80;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-code",1,0,"sexp_siginfo_t_get_si_code",
                      sexp_siginfo_t_get_si_code,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-error-number",1,0,"sexp_siginfo_t_get_si_errno",
                      sexp_siginfo_t_get_si_errno,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-number",1,0,"sexp_siginfo_t_get_si_signo",
                      sexp_siginfo_t_get_si_signo,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"parent-process-id",0,0,"sexp_parent_process_id_stub",
                      sexp_parent_process_id_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"current-process-id",0,0,"sexp_current_process_id_stub",
                      sexp_current_process_id_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"execvp",2,0,"sexp_execvp_stub",sexp_execvp_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x13;
        (op->value).port.offset = 0x13;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"%exit",1,0,"sexp_25_exit_stub",sexp_25_exit_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"kill",2,0,"sexp_kill_stub",sexp_kill_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"waitpid",2,0,"sexp_waitpid_stub",sexp_waitpid_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"fork",0,0,"sexp_fork_stub",sexp_fork_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"%fork",0,0,"sexp_25_fork_stub",sexp_25_fork_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"sleep",1,0,"sexp_sleep_stub",sexp_sleep_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"alarm",1,0,"sexp_alarm_stub",sexp_alarm_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"current-signal-mask",0,0,"sexp_current_signal_mask_stub",
                      sexp_current_signal_mask_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-mask-set!",1,0,"sexp_signal_mask_set_x_stub",
                      sexp_signal_mask_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-mask-unblock!",1,0,"sexp_signal_mask_unblock_x_stub",
                      sexp_signal_mask_unblock_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-mask-block!",1,0,"sexp_signal_mask_block_x_stub",
                      sexp_signal_mask_block_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x5;
        (op->value).type.print = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).type.dl = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-set-contains?",2,0,"sexp_signal_set_contains_p_stub",
                      sexp_signal_set_contains_p_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0xb;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-set-delete!",2,0,"sexp_signal_set_delete_x_stub",
                      sexp_signal_set_delete_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-set-add!",2,0,"sexp_signal_set_add_x_stub",
                      sexp_signal_set_add_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"signal-set-fill!",1,0,"sexp_signal_set_fill_x_stub",
                      sexp_signal_set_fill_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"make-signal-set",0,0,"sexp_make_signal_set_stub",
                      sexp_make_signal_set_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"set-signal-action!",2,0,"sexp_set_signal_action_x_stub",
                      sexp_set_signal_action_x_stub,0);
      call_sigaction.__sigaction_handler.sa_handler = sexp_call_sigaction;
      call_sigaction.sa_flags = 0x10000004;
      sigfillset((sigset_t *)&call_sigaction.sa_mask);
      call_sigdefault.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      call_sigignore.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
      memset(sexp_signal_contexts,0,0x100);
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      psVar5 = (sexp_conflict)0x43e;
    }
  }
  return psVar5;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_sigset_t_type_obj;
  sexp sexp_siginfo_t_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "wait/no-hang", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, WNOHANG));
  name = sexp_intern(ctx, "signal/tty-output", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTTOU));
  name = sexp_intern(ctx, "signal/tty-input", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTTIN));
  name = sexp_intern(ctx, "signal/tty-stop", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTSTP));
  name = sexp_intern(ctx, "signal/stop", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGSTOP));
  name = sexp_intern(ctx, "signal/continue", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGCONT));
  name = sexp_intern(ctx, "signal/child", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGCHLD));
  name = sexp_intern(ctx, "signal/user2", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGUSR2));
  name = sexp_intern(ctx, "signal/user1", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGUSR1));
  name = sexp_intern(ctx, "signal/term", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGTERM));
  name = sexp_intern(ctx, "signal/alarm", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGALRM));
  name = sexp_intern(ctx, "signal/pipe", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGPIPE));
  name = sexp_intern(ctx, "signal/segv", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGSEGV));
  name = sexp_intern(ctx, "signal/kill", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGKILL));
  name = sexp_intern(ctx, "signal/fpe", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGFPE));
  name = sexp_intern(ctx, "signal/abort", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGABRT));
  name = sexp_intern(ctx, "signal/illegal", 14);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGILL));
  name = sexp_intern(ctx, "signal/quit", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGQUIT));
  name = sexp_intern(ctx, "signal/interrupt", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGINT));
  name = sexp_intern(ctx, "signal/hang-up", 14);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SIGHUP));
  name = sexp_c_string(ctx, "sigset_t", -1);
  sexp_sigset_t_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_sigset_t_type_obj);
  tmp = sexp_make_type_predicate(ctx, name, sexp_sigset_t_type_obj);
  name = sexp_intern(ctx, "signal-set?", 11);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "siginfo_t", -1);
  sexp_siginfo_t_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_siginfo_t_type_obj);
  sexp_type_slots(sexp_siginfo_t_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_status", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_uid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_pid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_code", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_errno", -1));
  sexp_push(ctx, sexp_type_slots(sexp_siginfo_t_type_obj), sexp_intern(ctx, "si_signo", -1));
  sexp_type_getters(sexp_siginfo_t_type_obj) = sexp_make_vector(ctx, SEXP_SIX, SEXP_FALSE);
  sexp_type_setters(sexp_siginfo_t_type_obj) = sexp_make_vector(ctx, SEXP_SIX, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_siginfo_t_type_obj);
  name = sexp_intern(ctx, "signal-info?", 12);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "signal-status", 1, sexp_siginfo_t_get_si_status);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-uid", 1, sexp_siginfo_t_get_si_uid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-pid", 1, sexp_siginfo_t_get_si_pid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-code", 1, sexp_siginfo_t_get_si_code);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-error-number", 1, sexp_siginfo_t_get_si_errno);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-number", 1, sexp_siginfo_t_get_si_signo);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_siginfo_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "parent-process-id", 0, sexp_parent_process_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-process-id", 0, sexp_current_process_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "execvp", 2, sexp_execvp_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
  }
  op = sexp_define_foreign(ctx, env, "%exit", 1, sexp_25_exit_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "kill", 2, sexp_kill_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "waitpid", 2, sexp_waitpid_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "fork", 0, sexp_fork_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "%fork", 0, sexp_25_fork_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "sleep", 1, sexp_sleep_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "alarm", 1, sexp_alarm_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-signal-mask", 0, sexp_current_signal_mask_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-set!", 1, sexp_signal_mask_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-unblock!", 1, sexp_signal_mask_unblock_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-mask-block!", 1, sexp_signal_mask_block_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "signal-set-contains?", 2, sexp_signal_set_contains_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-delete!", 2, sexp_signal_set_delete_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-add!", 2, sexp_signal_set_add_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "signal-set-fill!", 1, sexp_signal_set_fill_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "make-signal-set", 0, sexp_make_signal_set_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sigset_t_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "set-signal-action!", 2, sexp_set_signal_action_x_stub);
  sexp_init_signals(ctx, env);
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}